

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

MessagePattern * __thiscall
icu_63::MessagePattern::operator=(MessagePattern *this,MessagePattern *other)

{
  ushort uVar1;
  UBool UVar2;
  ushort uVar3;
  uint in_EAX;
  UErrorCode errorCode;
  undefined8 uStack_18;
  
  if (this != other) {
    this->aposMode = other->aposMode;
    uStack_18._0_4_ = in_EAX;
    UnicodeString::operator=(&this->msg,&other->msg);
    this->hasArgNames = other->hasArgNames;
    this->hasArgNumbers = other->hasArgNumbers;
    this->needsAutoQuoting = other->needsAutoQuoting;
    uStack_18 = (ulong)(uint)uStack_18;
    UVar2 = copyStorage(this,other,(UErrorCode *)((long)&uStack_18 + 4));
    if (UVar2 == '\0') {
      uVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
      uVar3 = 2;
      if ((uVar1 & 1) == 0) {
        uVar3 = uVar1 & 0x1e;
      }
      (this->msg).fUnion.fStackFields.fLengthAndFlags = uVar3;
      this->partsLength = 0;
      this->numericValuesLength = 0;
      *(undefined4 *)((long)&this->numericValuesLength + 3) = 0;
    }
  }
  return this;
}

Assistant:

MessagePattern &
MessagePattern::operator=(const MessagePattern &other) {
    if(this==&other) {
        return *this;
    }
    aposMode=other.aposMode;
    msg=other.msg;
    hasArgNames=other.hasArgNames;
    hasArgNumbers=other.hasArgNumbers;
    needsAutoQuoting=other.needsAutoQuoting;
    UErrorCode errorCode=U_ZERO_ERROR;
    if(!copyStorage(other, errorCode)) {
        clear();
    }
    return *this;
}